

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O0

int main(int32 argc,char **argv)

{
  char *pcVar1;
  FILE *__stream;
  ps_decoder_t *ps_00;
  FILE *ctlfh;
  char *ctl;
  cmd_ln_t *config;
  ps_decoder_t *ps;
  char **argv_local;
  int32 argc_local;
  
  ctl = (char *)cmd_ln_parse_r((ps_config_t *)0x0,ps_args_def,argc,argv,1);
  if ((cmd_ln_t *)ctl != (cmd_ln_t *)0x0) {
    pcVar1 = ps_config_str((cmd_ln_t *)ctl,"argfile");
    if (pcVar1 != (char *)0x0) {
      ctl = (char *)cmd_ln_parse_file_r((ps_config_t *)ctl,ps_args_def,pcVar1,0);
    }
  }
  if (ctl == (char *)0x0) {
    err_set_loglevel(ERR_INFO);
    cmd_ln_log_help_r((ps_config_t *)0x0,ps_args_def);
    argv_local._4_4_ = 1;
  }
  else {
    pcVar1 = ps_config_str((cmd_ln_t *)ctl,"ctl");
    if (pcVar1 == (char *)0x0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
              ,0x3a8,"-ctl argument not present, nothing to do in batch mode!\n");
      exit(1);
    }
    __stream = fopen(pcVar1,"r");
    if (__stream == (FILE *)0x0) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                     ,0x3ab,"Failed to open control file \'%s\'",pcVar1);
      exit(1);
    }
    ps_default_search_args((ps_config_t *)ctl);
    ps_00 = ps_init((ps_config_t *)ctl);
    if (ps_00 == (ps_decoder_t *)0x0) {
      ps_config_free((ps_config_t *)ctl);
      fclose(__stream);
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
              ,0x3b2,"PocketSphinx decoder init failed\n");
      exit(1);
    }
    process_ctl(ps_00,(cmd_ln_t *)ctl,(FILE *)__stream);
    fclose(__stream);
    ps_free(ps_00);
    ps_config_free((ps_config_t *)ctl);
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int32 argc, char *argv[])
{
    ps_decoder_t *ps;
    cmd_ln_t *config;
    char const *ctl;
    FILE *ctlfh;

    config = cmd_ln_parse_r(NULL, ps_args_def, argc, argv, TRUE);

    /* Handle argument file as -argfile. */
    if (config && (ctl = ps_config_str(config, "argfile")) != NULL) {
        config = cmd_ln_parse_file_r(config, ps_args_def, ctl, FALSE);
    }
    
    if (config == NULL) {
        /* This probably just means that we got no arguments. */
        err_set_loglevel(ERR_INFO);
        cmd_ln_log_help_r(NULL, ps_args_def);
        return 1;
    }

    if ((ctl = ps_config_str(config, "ctl")) == NULL) {
        E_FATAL("-ctl argument not present, nothing to do in batch mode!\n");
    }
    if ((ctlfh = fopen(ctl, "r")) == NULL) {
        E_FATAL_SYSTEM("Failed to open control file '%s'", ctl);
    }

    ps_default_search_args(config);
    if (!(ps = ps_init(config))) {
        ps_config_free(config);
        fclose(ctlfh);
        E_FATAL("PocketSphinx decoder init failed\n");
    }

    process_ctl(ps, config, ctlfh);

    fclose(ctlfh);
    ps_free(ps);
    ps_config_free(config);
    return 0;
}